

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

void gf64_mul(uint64_t *result,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t Z0;
  uint64_t X0;
  uint64_t t;
  int i;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *result_local;
  
  Z0 = 0;
  X0 = *arg1 >> 0x38 | (*arg1 & 0xff000000000000) >> 0x28 | (*arg1 & 0xff0000000000) >> 0x18 |
       (*arg1 & 0xff00000000) >> 8 | (*arg1 & 0xff000000) << 8 | (*arg1 & 0xff0000) << 0x18 |
       (*arg1 & 0xff00) << 0x28 | *arg1 << 0x38;
  t = *arg2 >> 0x38 | (*arg2 & 0xff000000000000) >> 0x28 | (*arg2 & 0xff0000000000) >> 0x18 |
      (*arg2 & 0xff00000000) >> 8 | (*arg2 & 0xff000000) << 8 | (*arg2 & 0xff0000) << 0x18 |
      (*arg2 & 0xff00) << 0x28 | *arg2 << 0x38;
  for (i = 0; i < 0x3f; i = i + 1) {
    if ((t & 1) != 0) {
      Z0 = X0 ^ Z0;
    }
    t = t >> 1;
    if ((X0 & 0x8000000000000000) == 0) {
      X0 = X0 << 1;
    }
    else {
      X0 = X0 << 1 ^ 0x1b;
    }
  }
  if ((t & 1) != 0) {
    Z0 = X0 ^ Z0;
  }
  *result = Z0 >> 0x38 | (Z0 & 0xff000000000000) >> 0x28 | (Z0 & 0xff0000000000) >> 0x18 |
            (Z0 & 0xff00000000) >> 8 | (Z0 & 0xff000000) << 8 | (Z0 & 0xff0000) << 0x18 |
            (Z0 & 0xff00) << 0x28 | Z0 << 0x38;
  return;
}

Assistant:

static void gf64_mul (uint64_t *result, uint64_t *arg1, uint64_t *arg2)
{
	int i = 0;
	register uint64_t t, X0;
	uint64_t Z0 = 0;

#ifdef L_ENDIAN
	X0 = BSWAP64(*arg1);
#else
	X0 = *arg1;
#endif

#ifdef L_ENDIAN
	t = BSWAP64(*(arg2));
#else
	t = *(arg2);
#endif

	for (i = 0; i < 63; i++) {
		if (t & 0x1) {
			Z0 ^= X0;
		}
		t >>= 1;
		if (X0 & 0x8000000000000000) {
			X0 <<= 1;
			X0 ^= 0x1b;
		}
		else {
			X0 <<= 1;
		}
	}

	if (t & 0x1) {
		Z0 ^= X0;
	}

#ifdef L_ENDIAN
	*(result) = BSWAP64(Z0);
#else
	*(result) = Z0;
#endif
}